

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool __thiscall
vera::Shader::load(Shader *this,string *_fragmentSrc,string *_vertexSrc,ShaderErrorResolve _onError,
                  bool _verbose)

{
  undefined4 uVar1;
  string *_source;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  uint uVar5;
  size_type __n;
  reference pvVar6;
  ostream *poVar7;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders DVar8;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_01;
  DefaultShaders extraout_EDX_02;
  DefaultShaders _type_00;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  string lineNum;
  size_t end;
  size_t start;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_158;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_150;
  string local_148 [8];
  string error;
  undefined1 local_120 [8];
  vector<char,_std::allocator<char>_> infoLog;
  GLint infoLength;
  GLint isLinked;
  string local_e0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  byte local_2d;
  ShaderErrorResolve local_2c;
  bool _verbose_local;
  string *psStack_28;
  ShaderErrorResolve _onError_local;
  string *_vertexSrc_local;
  string *_fragmentSrc_local;
  Shader *this_local;
  
  local_2d = _verbose;
  local_2c = _onError;
  psStack_28 = _vertexSrc;
  _vertexSrc_local = _fragmentSrc;
  _fragmentSrc_local = (string *)this;
  setVersionFromCode(_fragmentSrc);
  bVar2 = std::operator==(&this->m_fragmentSource,"");
  DVar8 = extraout_EDX;
  if ((bVar2) || (bVar2 = std::operator==(&this->m_vertexSource,""), DVar8 = extraout_EDX_00, bVar2)
     ) {
    getDefaultSrc_abi_cxx11_(&local_50,(vera *)0xb,DVar8);
    std::__cxx11::string::operator=((string *)&this->m_fragmentSource,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    getDefaultSrc_abi_cxx11_(&local_70,(vera *)0xa,_type);
    std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  GVar3 = compileShader(this,psStack_28,0x8b31,(bool)(local_2d & 1));
  this->m_vertexShader = GVar3;
  if (this->m_vertexShader == 0) {
    if (local_2c == SHOW_MAGENTA_SHADER) {
      DVar8 = extraout_EDX_01;
      if ((local_2d & 1) != 0) {
        printf("Error compiling vertex shader, loading magenta shader\n");
        DVar8 = extraout_EDX_02;
      }
      getDefaultSrc_abi_cxx11_(&local_90,(vera *)0xb,DVar8);
      getDefaultSrc_abi_cxx11_(&local_b0,(vera *)0xa,_type_00);
      load(this,&local_90,&local_b0,DONT_KEEP_SHADER,(bool)(local_2d & 1));
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      return false;
    }
    if (local_2c == REVERT_TO_PREVIOUS_SHADER) {
      if ((local_2d & 1) != 0) {
        printf("Error compiling vertex shader, reverting to default shader\n");
      }
      load(this,&this->m_previousFragmentSource,&this->m_previousVertexSource,SHOW_MAGENTA_SHADER,
           (bool)(local_2d & 1));
      return false;
    }
  }
  GVar3 = compileShader(this,_vertexSrc_local,0x8b30,(bool)(local_2d & 1));
  this->m_fragmentShader = GVar3;
  if (this->m_fragmentShader == 0) {
    if (local_2c == SHOW_MAGENTA_SHADER) {
      DVar8 = extraout_EDX_03;
      if ((local_2d & 1) != 0) {
        printf("Error compiling fragment shader, loading magenta shader\n");
        DVar8 = extraout_EDX_04;
      }
      getDefaultSrc_abi_cxx11_(&local_e0,(vera *)0xb,DVar8);
      getDefaultSrc_abi_cxx11_((string *)&infoLength,(vera *)0xa,_type_01);
      load(this,&local_e0,(string *)&infoLength,DONT_KEEP_SHADER,(bool)(local_2d & 1));
      std::__cxx11::string::~string((string *)&infoLength);
      std::__cxx11::string::~string((string *)&local_e0);
      return false;
    }
    if (local_2c == REVERT_TO_PREVIOUS_SHADER) {
      if ((local_2d & 1) != 0) {
        printf("Error compiling fragment shader, reverting to default shader\n");
      }
      load(this,&this->m_previousFragmentSource,&this->m_previousVertexSource,SHOW_MAGENTA_SHADER,
           (bool)(local_2d & 1));
      return false;
    }
  }
  if (this->m_program != 0) {
    glDeleteProgram(this->m_program);
  }
  GVar3 = glCreateProgram();
  this->m_program = GVar3;
  glAttachShader(this->m_program,this->m_vertexShader);
  glAttachShader(this->m_program,this->m_fragmentShader);
  glLinkProgram(this->m_program);
  if (local_2c != DONT_KEEP_SHADER) {
    std::__cxx11::string::operator=((string *)&this->m_fragmentSource,(string *)_vertexSrc_local);
    std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)psStack_28);
    std::__cxx11::string::operator=
              ((string *)&this->m_previousFragmentSource,(string *)_vertexSrc_local);
    std::__cxx11::string::operator=((string *)&this->m_previousVertexSource,(string *)psStack_28);
  }
  glGetProgramiv(this->m_program,0x8b82,
                 &infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  if (infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0) {
    infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    glGetProgramiv(this->m_program,0x8b84,
                   &infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    if (1 < (int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
      __n = (size_type)(int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_120,__n,
                 (allocator_type *)(error.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(error.field_2._M_local_buf + 0xf));
      uVar1 = infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      GVar3 = this->m_program;
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_120,0);
      glGetProgramInfoLog(GVar3,uVar1,0,pvVar6);
      local_150._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_120);
      local_158._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::end
                             ((vector<char,_std::allocator<char>_> *)local_120);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_148,local_150,local_158,(allocator<char> *)((long)&start + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error linking shader: ");
      poVar7 = std::operator<<(poVar7,local_148);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::find((char *)local_148,0x60ebe3);
      lineNum.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)local_148,0x5da704);
      std::__cxx11::string::substr((ulong)local_190,(ulong)local_148);
      iVar4 = toInt((string *)local_190);
      if (0 < iVar4) {
        uVar5 = toInt((string *)local_190);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,uVar5);
        poVar7 = std::operator<<(poVar7,": ");
        _source = _vertexSrc_local;
        uVar5 = toInt((string *)local_190);
        getLineNumber(&local_1b0,_source,uVar5);
        poVar7 = std::operator<<(poVar7,(string *)&local_1b0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string(local_148);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_120);
    }
    if ((local_2d & 1) != 0) {
      printf("Linking fail, deleting program and loading error shader\n");
    }
    glDeleteProgram(this->m_program);
    getDefaultSrc_abi_cxx11_(&local_1d0,(vera *)0xb,_type_02);
    getDefaultSrc_abi_cxx11_(&local_1f0,(vera *)0xa,_type_03);
    load(this,&local_1d0,&local_1f0,DONT_KEEP_SHADER,(bool)(local_2d & 1));
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = false;
  }
  else {
    glDeleteShader(this->m_vertexShader);
    glDeleteShader(this->m_fragmentShader);
    this->m_needsReloading = false;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Shader::load(const std::string& _fragmentSrc, const std::string& _vertexSrc, ShaderErrorResolve _onError, bool _verbose) {
    setVersionFromCode(_fragmentSrc);
    if (m_fragmentSource == "" || m_vertexSource == "") {
        m_fragmentSource = getDefaultSrc(FRAG_ERROR);
        m_vertexSource = getDefaultSrc(VERT_ERROR);
    }


    // VERTEX
    m_vertexShader = compileShader(_vertexSrc, GL_VERTEX_SHADER, _verbose);
    if (!m_vertexShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling vertex shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // FRAGMENT
    m_fragmentShader = compileShader(_fragmentSrc, GL_FRAGMENT_SHADER, _verbose);
    if (!m_fragmentShader) {
        if (_onError == SHOW_MAGENTA_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, loading magenta shader\n");
            load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
            return false;
        }
        else if (_onError == REVERT_TO_PREVIOUS_SHADER) {
            if (_verbose)
                printf("Error compiling fragment shader, reverting to default shader\n");
            load(m_previousFragmentSource, m_previousVertexSource, SHOW_MAGENTA_SHADER, _verbose);
            return false;
        }
    }

    // PROGRAM
    if (m_program != 0)
        glDeleteProgram(m_program);
    m_program = glCreateProgram();
    glAttachShader(m_program, m_vertexShader);
    glAttachShader(m_program, m_fragmentShader);
    glLinkProgram(m_program);

    // SUCCESS
    if (_onError != DONT_KEEP_SHADER) {
        // we need to explicitely remember the previous shader or REVERT_TO_PREVIOUS_SHADER always falls through to SHOW_MAGENTA_SHADER.
        m_fragmentSource = _fragmentSrc;
        m_vertexSource = _vertexSrc;
        m_previousFragmentSource = _fragmentSrc;
        m_previousVertexSource = _vertexSrc;
    }

    GLint isLinked;
    glGetProgramiv(m_program, GL_LINK_STATUS, &isLinked);

    if (isLinked == GL_FALSE) {
        GLint infoLength = 0;
        glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &infoLength);

        #if !defined(SWIG)
        if (infoLength > 1) {
            std::vector<GLchar> infoLog(infoLength);
            glGetProgramInfoLog(m_program, infoLength, NULL, &infoLog[0]);
            std::string error(infoLog.begin(),infoLog.end());
            // printf("Error linking shader:\n%s\n", error);
            std::cerr << "Error linking shader: " << error << std::endl;

            std::size_t start = error.find("line ")+5;
            std::size_t end = error.find_last_of(")");
            std::string lineNum = error.substr(start,end-start);
            if (toInt(lineNum) > 0)
                std::cerr << (unsigned)toInt(lineNum) << ": " << getLineNumber(_fragmentSrc,(unsigned)toInt(lineNum)) << std::endl;
        }
        #endif

        if (_verbose)
            printf("Linking fail, deleting program and loading error shader\n");
        glDeleteProgram(m_program);
        load(getDefaultSrc(FRAG_ERROR), getDefaultSrc(VERT_ERROR), DONT_KEEP_SHADER, _verbose);
        return false;
    }
    else {
        glDeleteShader(m_vertexShader);
        glDeleteShader(m_fragmentShader);

        m_needsReloading = false;
        // m_defineChange = false;
        return true;
    }
}